

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall
LinearScan::RecordUse
          (LinearScan *this,Lifetime *lifetime,Instr *instr,RegOpnd *regOpnd,bool isFromBailout)

{
  RealCount *pRVar1;
  uint uVar2;
  bool bVar3;
  BOOLEAN BVar4;
  BOOL BVar5;
  Type pSVar6;
  uint32 newUseValue;
  
  newUseValue = 0;
  if (this->currentOpHelperBlock == (OpHelperBlock *)0x0 && !isFromBailout) {
    uVar2 = this->loopNest;
    if (uVar2 < 6) {
      newUseValue = 1 << ((char)uVar2 * '\x03' & 0x1fU);
    }
    else {
      newUseValue = uVar2 * 0x8000 - 0x28000;
    }
  }
  if (regOpnd == (RegOpnd *)0x0) {
LAB_0058d611:
    BVar5 = Func::HasTry(this->func);
    if (BVar5 != 0) {
      bVar3 = Func::DoOptimizeTry(this->func);
      if (((!bVar3) && (this->loopNest != 0)) && (lifetime->lastUseLabel != this->lastLabel)) {
        BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->liveOnBackEdgeSyms,(lifetime->sym->super_Sym).m_id);
        if ((BVar4 != '\0') &&
           ((lifetime->previousDefBlockNumber != this->currentBlockNumber ||
            ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
             (lifetime->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next == &lifetime->defList))))
        goto LAB_0058d5c5;
      }
    }
    if (!isFromBailout) {
      Lifetime::SubFromUseCount(lifetime,newUseValue,this->curLoop);
    }
  }
  else {
    bVar3 = StackSym::IsConst(regOpnd->m_sym);
    if (!bVar3) goto LAB_0058d611;
LAB_0058d5c5:
    pSVar6 = (Type)new<Memory::ArenaAllocator>(0x10,(lifetime->useList).allocator,0x366bee);
    pSVar6[1].next = (Type)instr;
    pSVar6->next = (lifetime->useList).
                   super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
    (lifetime->useList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar6;
    pRVar1 = &(lifetime->useList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>.
              super_RealCount;
    pRVar1->count = pRVar1->count + 1;
    lifetime->lastUseLabel = this->lastLabel;
    Lifetime::AddToUseCountAdjust(lifetime,newUseValue,this->curLoop,this->func);
  }
  if (this->loopNest != 0) {
    RecordLoopUse(this,lifetime,lifetime->reg);
    return;
  }
  return;
}

Assistant:

void
LinearScan::RecordUse(Lifetime * lifetime, IR::Instr * instr, IR::RegOpnd * regOpnd, bool isFromBailout)
{
    uint32 useCountCost = LinearScan::GetUseSpillCost(this->loopNest, (this->currentOpHelperBlock != nullptr || isFromBailout));

    // We only spill at the use for constants (i.e. reload) or for function with try blocks. We don't
    // have real accurate flow info for the later.
    if ((regOpnd && regOpnd->m_sym->IsConst())
          || (
                 (this->func->HasTry() && !this->func->DoOptimizeTry()) &&
                 this->IsInLoop() &&
                 lifetime->lastUseLabel != this->lastLabel &&
                 this->liveOnBackEdgeSyms->Test(lifetime->sym->m_id) &&
                 !(lifetime->previousDefBlockNumber == currentBlockNumber && !lifetime->defList.Empty())
             ))
    {
        // Keep track of all the uses of this lifetime in case we decide to spill it.
        // Note that we won't need to insert reloads if the use are not in a loop,
        // unless it is a const. We always reload const instead of spilling to the stack.
        //
        // We also don't need to insert reloads if the previous use was in the same basic block (the first use in the block
        // would have done the reload), or the previous def is in the same basic block and the value is still live. Furthermore,
        // if the previous def is in the same basic block, the value is still live, and there's another def after this use in
        // the same basic block, the previous def may not do a spill store, so we must not reload the value from the stack.
        lifetime->useList.Prepend(instr);
        lifetime->lastUseLabel = this->lastLabel;
        lifetime->AddToUseCountAdjust(useCountCost, this->curLoop, this->func);
    }
    else
    {
        if (!isFromBailout)
        {
            // Since we won't reload this use if the lifetime gets spilled, adjust the spill cost to reflect this.
            lifetime->SubFromUseCount(useCountCost, this->curLoop);
        }
    }
    if (this->IsInLoop())
    {
        this->RecordLoopUse(lifetime, lifetime->reg);
    }
}